

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O1

Lf_Man_t * Lf_ManAlloc(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  size_t __size;
  int iVar1;
  uint uVar2;
  Lf_Man_t *pLVar3;
  word *pwVar4;
  Vec_Mem_t *p;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Lf_Bst_t *pLVar7;
  void **ppvVar8;
  float *pfVar9;
  ulong uVar10;
  Gia_Obj_t *pGVar11;
  abctime aVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  timespec ts;
  timespec local_40;
  
  if (0x1e < pPars->nCutNum - 2U) {
    __assert_fail("pPars->nCutNum > 1 && pPars->nCutNum <= LF_CUT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                  ,0x795,"Lf_Man_t *Lf_ManAlloc(Gia_Man_t *, Jf_Par_t *)");
  }
  if (0xb < pPars->nLutSize - 2U) {
    __assert_fail("pPars->nLutSize > 1 && pPars->nLutSize <= LF_LEAF_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                  ,0x796,"Lf_Man_t *Lf_ManAlloc(Gia_Man_t *, Jf_Par_t *)");
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  if (pGia->vMapping != (Vec_Int_t *)0x0) {
    piVar6 = pGia->vMapping->pArray;
    if (piVar6 != (int *)0x0) {
      free(piVar6);
      pGia->vMapping->pArray = (int *)0x0;
    }
    if (pGia->vMapping != (Vec_Int_t *)0x0) {
      free(pGia->vMapping);
      pGia->vMapping = (Vec_Int_t *)0x0;
    }
  }
  Gia_ManCleanValue(pGia);
  if (pGia->pSibls != (int *)0x0) {
    Gia_ManSetPhase(pGia);
  }
  pLVar3 = (Lf_Man_t *)calloc(1,0x1a0);
  Lf_ManAnalyzeCoDrivers(pGia,&pLVar3->nCoDrivers,&pLVar3->nInverters);
  if (pPars->fPower != 0) {
    Lf_ManComputeSwitching(pGia,&pLVar3->vSwitches);
  }
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    aVar12 = -1;
  }
  else {
    aVar12 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  pLVar3->clkStart = aVar12;
  pLVar3->pGia = pGia;
  pLVar3->pPars = pPars;
  iVar1 = pPars->nLutSize;
  iVar15 = (int)((long)iVar1 + 7U >> 1);
  pLVar3->nCutWords = iVar15;
  pLVar3->nSetWords = iVar15 * pPars->nCutNum;
  if (pPars->fCutMin == 0) {
    p = (Vec_Mem_t *)0x0;
  }
  else {
    iVar15 = 1 << ((char)iVar1 - 6U & 0x1f);
    if (iVar1 < 7) {
      iVar15 = 1;
    }
    __size = (long)iVar15 * 8;
    pwVar4 = (word *)malloc(__size);
    p = (Vec_Mem_t *)calloc(1,0x30);
    p->nEntrySize = iVar15;
    p->LogPageSze = 0xc;
    p->PageMask = 0xfff;
    p->iPage = -1;
    if ((p->vTable != (Vec_Int_t *)0x0) || (p->vNexts != (Vec_Int_t *)0x0)) {
      __assert_fail("p->vTable == NULL && p->vNexts == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                    ,0x13b,"void Vec_MemHashAlloc(Vec_Mem_t *, int)");
    }
    uVar14 = 9999;
    while( true ) {
      do {
        uVar16 = uVar14;
        uVar14 = uVar16 + 1;
      } while ((uVar16 & 1) != 0);
      if (uVar14 < 9) break;
      iVar1 = 5;
      while (uVar14 % (iVar1 - 2U) != 0) {
        uVar2 = iVar1 * iVar1;
        iVar1 = iVar1 + 2;
        if (uVar14 < uVar2) goto LAB_00764894;
      }
    }
LAB_00764894:
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    uVar2 = 0x10;
    if (0xe < uVar16) {
      uVar2 = uVar14;
    }
    pVVar5->nSize = 0;
    pVVar5->nCap = uVar2;
    piVar6 = (int *)malloc((long)(int)uVar2 << 2);
    pVVar5->pArray = piVar6;
    pVVar5->nSize = uVar14;
    if (piVar6 != (int *)0x0) {
      memset(piVar6,0xff,(long)(int)uVar14 << 2);
    }
    p->vTable = pVVar5;
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = 10000;
    pVVar5->nSize = 0;
    piVar6 = (int *)malloc(40000);
    pVVar5->pArray = piVar6;
    p->vNexts = pVVar5;
    memset(pwVar4,0,__size);
    iVar1 = Vec_MemHashInsert(p,pwVar4);
    if (iVar1 != 0) {
      __assert_fail("Value == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                    ,0x19e,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
    }
    memset(pwVar4,0xaa,__size);
    iVar1 = Vec_MemHashInsert(p,pwVar4);
    if (iVar1 != 1) {
      __assert_fail("Value == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                    ,0x1a3,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
    }
    if (pwVar4 != (word *)0x0) {
      free(pwVar4);
    }
  }
  pLVar3->vTtMem = p;
  if ((pPars->fCutMin != 0) && (pPars->fUseMux7 != 0)) {
    iVar1 = 1 << ((char)pPars->nLutSize - 6U & 0x1f);
    if (pPars->nLutSize < 7) {
      iVar1 = 1;
    }
    pwVar4 = (word *)malloc((long)iVar1 << 3);
    memset(pwVar4,0xca,(long)iVar1 << 3);
    iVar1 = Vec_MemHashInsert(p,pwVar4);
    if (iVar1 != 2) {
      __assert_fail("Value == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                    ,0x1ac,"void Vec_MemAddMuxTT(Vec_Mem_t *, int)");
    }
    if (pwVar4 != (word *)0x0) {
      free(pwVar4);
    }
  }
  pLVar7 = (Lf_Bst_t *)
           calloc((long)((~(pGia->vCos->nSize + pGia->vCis->nSize) + pGia->nObjs) - pGia->nBufs),
                  0x20);
  pLVar3->pObjBests = pLVar7;
  if ((pLVar3->vFreeSets).nCap < 0x4000) {
    piVar6 = (pLVar3->vFreeSets).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc(0x10000);
    }
    else {
      piVar6 = (int *)realloc(piVar6,0x10000);
    }
    (pLVar3->vFreeSets).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_00764eaa;
    (pLVar3->vFreeSets).nCap = 0x4000;
  }
  if ((pLVar3->vFreePages).nCap < 0x100) {
    ppvVar8 = (pLVar3->vFreePages).pArray;
    if (ppvVar8 == (void **)0x0) {
      ppvVar8 = (void **)malloc(0x800);
    }
    else {
      ppvVar8 = (void **)realloc(ppvVar8,0x800);
    }
    (pLVar3->vFreePages).pArray = ppvVar8;
    (pLVar3->vFreePages).nCap = 0x100;
  }
  (pLVar3->vStoreOld).LogPage = 0;
  (pLVar3->vStoreOld).MaskPage = 0;
  (pLVar3->vStoreOld).nCutWords = 0;
  (pLVar3->vStoreOld).iCur = 0;
  (pLVar3->vStoreOld).vPages.nCap = 0;
  (pLVar3->vStoreOld).vPages.nSize = 0;
  (pLVar3->vStoreOld).vPages.pArray = (void **)0x0;
  (pLVar3->vStoreOld).LogPage = 0x10;
  (pLVar3->vStoreOld).MaskPage = 0xffff;
  iVar1 = pLVar3->nCutWords;
  iVar15 = (pLVar3->vOffsets).nCap;
  (pLVar3->vStoreOld).nCutWords = iVar1;
  (pLVar3->vStoreOld).vFree = &pLVar3->vFreePages;
  (pLVar3->vStoreNew).LogPage = 0;
  (pLVar3->vStoreNew).MaskPage = 0;
  (pLVar3->vStoreNew).nCutWords = 0;
  (pLVar3->vStoreNew).iCur = 0;
  (pLVar3->vStoreNew).vPages.nCap = 0;
  (pLVar3->vStoreNew).vPages.nSize = 0;
  (pLVar3->vStoreNew).vPages.pArray = (void **)0x0;
  (pLVar3->vStoreNew).LogPage = 0x10;
  (pLVar3->vStoreNew).MaskPage = 0xffff;
  (pLVar3->vStoreNew).nCutWords = iVar1;
  (pLVar3->vStoreNew).vFree = &pLVar3->vFreePages;
  uVar14 = pGia->nObjs;
  if (iVar15 < (int)uVar14) {
    piVar6 = (pLVar3->vOffsets).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar14 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar14 << 2);
    }
    (pLVar3->vOffsets).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_00764eaa;
    (pLVar3->vOffsets).nCap = uVar14;
  }
  if (0 < (int)uVar14) {
    memset((pLVar3->vOffsets).pArray,0xff,(ulong)uVar14 * 4);
  }
  (pLVar3->vOffsets).nSize = uVar14;
  uVar14 = pGia->nObjs;
  if ((pLVar3->vRequired).nCap < (int)uVar14) {
    piVar6 = (pLVar3->vRequired).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar14 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar14 << 2);
    }
    (pLVar3->vRequired).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_00764eaa;
    (pLVar3->vRequired).nCap = uVar14;
  }
  if (0 < (int)uVar14) {
    piVar6 = (pLVar3->vRequired).pArray;
    uVar10 = 0;
    do {
      piVar6[uVar10] = 1000000000;
      uVar10 = uVar10 + 1;
    } while (uVar14 != uVar10);
  }
  (pLVar3->vRequired).nSize = uVar14;
  uVar14 = (~(pGia->vCos->nSize + pGia->vCis->nSize) + pGia->nObjs) - pGia->nBufs;
  if ((pLVar3->vCutSets).nCap < (int)uVar14) {
    piVar6 = (pLVar3->vCutSets).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar14 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar14 << 2);
    }
    (pLVar3->vCutSets).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_00764eaa;
    (pLVar3->vCutSets).nCap = uVar14;
  }
  if (0 < (int)uVar14) {
    memset((pLVar3->vCutSets).pArray,0xff,(ulong)uVar14 << 2);
  }
  (pLVar3->vCutSets).nSize = uVar14;
  uVar14 = (~(pGia->vCos->nSize + pGia->vCis->nSize) + pGia->nObjs) - pGia->nBufs;
  if ((pLVar3->vFlowRefs).nCap < (int)uVar14) {
    pfVar9 = (pLVar3->vFlowRefs).pArray;
    if (pfVar9 == (float *)0x0) {
      pfVar9 = (float *)malloc((long)(int)uVar14 << 2);
    }
    else {
      pfVar9 = (float *)realloc(pfVar9,(long)(int)uVar14 << 2);
    }
    (pLVar3->vFlowRefs).pArray = pfVar9;
    (pLVar3->vFlowRefs).nCap = uVar14;
  }
  if (0 < (int)uVar14) {
    memset((pLVar3->vFlowRefs).pArray,0,(ulong)uVar14 << 2);
  }
  (pLVar3->vFlowRefs).nSize = uVar14;
  uVar14 = (~(pGia->vCos->nSize + pGia->vCis->nSize) + pGia->nObjs) - pGia->nBufs;
  if ((pLVar3->vMapRefs).nCap < (int)uVar14) {
    piVar6 = (pLVar3->vMapRefs).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar14 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar14 << 2);
    }
    (pLVar3->vMapRefs).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_00764eaa;
    (pLVar3->vMapRefs).nCap = uVar14;
  }
  if (0 < (int)uVar14) {
    memset((pLVar3->vMapRefs).pArray,0,(ulong)uVar14 << 2);
  }
  (pLVar3->vMapRefs).nSize = uVar14;
  uVar14 = pGia->vCis->nSize;
  if ((pLVar3->vCiArrivals).nCap < (int)uVar14) {
    piVar6 = (pLVar3->vCiArrivals).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar14 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar14 << 2);
    }
    (pLVar3->vCiArrivals).pArray = piVar6;
    if (piVar6 == (int *)0x0) {
LAB_00764eaa:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pLVar3->vCiArrivals).nCap = uVar14;
  }
  if (0 < (int)uVar14) {
    memset((pLVar3->vCiArrivals).pArray,0,(ulong)uVar14 * 4);
  }
  (pLVar3->vCiArrivals).nSize = uVar14;
  iVar1 = pGia->nObjs;
  if (iVar1 < 1) {
    iVar15 = 0;
  }
  else {
    pGVar11 = pGia->pObjs;
    lVar13 = 0;
    iVar15 = 0;
    do {
      uVar14 = (uint)*(undefined8 *)pGVar11;
      if (((~uVar14 & 0x1fffffff) != 0 && -1 < (int)uVar14) &&
         ((((int)uVar14 < 0 || ((uVar14 & 0x1fffffff) == 0x1fffffff)) ||
          ((uVar14 & 0x1fffffff) != ((uint)((ulong)*(undefined8 *)pGVar11 >> 0x20) & 0x1fffffff)))))
      {
        if ((pLVar3->vOffsets).nSize <= lVar13) goto LAB_00764e8b;
        (pLVar3->vOffsets).pArray[lVar13] = iVar15;
        iVar15 = iVar15 + 1;
      }
      lVar13 = lVar13 + 1;
      iVar1 = pGia->nObjs;
      pGVar11 = pGVar11 + 1;
    } while (lVar13 < iVar1);
  }
  if (iVar15 != (~(pGia->vCos->nSize + pGia->vCis->nSize) + iVar1) - pGia->nBufs) {
    __assert_fail("k == Gia_ManAndNotBufNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                  ,0x7b6,"Lf_Man_t *Lf_ManAlloc(Gia_Man_t *, Jf_Par_t *)");
  }
  Lf_ManSetFlowRefs(pGia,&pLVar3->vFlowRefs,&pLVar3->vOffsets);
  pfVar9 = pPars->pTimesArr;
  if ((pfVar9 != (float *)0x0) && (pVVar5 = pGia->vCis, pGia->nRegs < pVVar5->nSize)) {
    lVar13 = 0;
    do {
      if ((pLVar3->vCiArrivals).nSize <= lVar13) {
LAB_00764e8b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pLVar3->vCiArrivals).pArray[lVar13] = (int)pfVar9[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar13 < (long)pVVar5->nSize - (long)pGia->nRegs);
  }
  return pLVar3;
}

Assistant:

Lf_Man_t * Lf_ManAlloc( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    Lf_Man_t * p; int i, k = 0;
    assert( pPars->nCutNum > 1  && pPars->nCutNum <= LF_CUT_MAX );
    assert( pPars->nLutSize > 1 && pPars->nLutSize <= LF_LEAF_MAX );
    ABC_FREE( pGia->pRefs );
    Vec_IntFreeP( &pGia->vMapping );
    Gia_ManCleanValue( pGia );
    if ( Gia_ManHasChoices(pGia) )
        Gia_ManSetPhase(pGia);
    p = ABC_CALLOC( Lf_Man_t, 1 );
    Lf_ManAnalyzeCoDrivers( pGia, &p->nCoDrivers, &p->nInverters );
    if ( pPars->fPower )
        Lf_ManComputeSwitching( pGia, &p->vSwitches );
    p->clkStart  = Abc_Clock();
    p->pGia      = pGia;
    p->pPars     = pPars;
    p->nCutWords = (sizeof(Lf_Cut_t)/sizeof(int) + pPars->nLutSize + 1) >> 1;
    p->nSetWords = p->nCutWords * pPars->nCutNum;
    p->vTtMem    = pPars->fCutMin ? Vec_MemAllocForTT( pPars->nLutSize, 0 ) : NULL;
    if ( pPars->fCutMin && pPars->fUseMux7 )
        Vec_MemAddMuxTT( p->vTtMem, pPars->nLutSize );
    p->pObjBests = ABC_CALLOC( Lf_Bst_t, Gia_ManAndNotBufNum(pGia) );
    Vec_IntGrow( &p->vFreeSets, (1<<14) );
    Vec_PtrGrow( &p->vFreePages, 256 );
    Lf_MemAlloc( &p->vStoreOld, 16, &p->vFreePages, p->nCutWords );
    Lf_MemAlloc( &p->vStoreNew, 16, &p->vFreePages, p->nCutWords );
    Vec_IntFill( &p->vOffsets,  Gia_ManObjNum(pGia), -1 );
    Vec_IntFill( &p->vRequired, Gia_ManObjNum(pGia), ABC_INFINITY );
    Vec_IntFill( &p->vCutSets,  Gia_ManAndNotBufNum(pGia), -1 );
    Vec_FltFill( &p->vFlowRefs, Gia_ManAndNotBufNum(pGia), 0 );
    Vec_IntFill( &p->vMapRefs,  Gia_ManAndNotBufNum(pGia), 0 );
    Vec_IntFill( &p->vCiArrivals, Gia_ManCiNum(pGia), 0 );
    Gia_ManForEachAndId( pGia, i )
        if ( !Gia_ObjIsBuf(Gia_ManObj(pGia, i)) )
            Vec_IntWriteEntry( &p->vOffsets, i, k++ );
    assert( k == Gia_ManAndNotBufNum(pGia) );
    Lf_ManSetFlowRefs( pGia, &p->vFlowRefs, &p->vOffsets );
    if ( pPars->pTimesArr )
        for ( i = 0; i < Gia_ManPiNum(pGia); i++ )
            Vec_IntWriteEntry( &p->vCiArrivals, i, pPars->pTimesArr[i] );
    return p;
}